

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_dialer_close(void *arg)

{
  void *item;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x58));
  if (*(char *)((long)arg + 0xe0) == '\0') {
    *(undefined1 *)((long)arg + 0xe0) = 1;
    for (item = nni_list_first((nni_list *)((long)arg + 200)); item != (void *)0x0;
        item = nni_list_next((nni_list *)((long)arg + 200),item)) {
      nni_aio_close((nni_aio *)((long)item + 0x818));
      nni_aio_close((nni_aio *)((long)item + 0x650));
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
  return;
}

Assistant:

static void
ws_dialer_close(void *arg)
{
	nni_ws_dialer *d = arg;
	nni_ws        *ws;
	nni_mtx_lock(&d->mtx);
	if (d->closed) {
		nni_mtx_unlock(&d->mtx);
		return;
	}
	d->closed = true;
	NNI_LIST_FOREACH (&d->wspend, ws) {
		nni_aio_close(&ws->connaio);
		nni_aio_close(&ws->httpaio);
	}
	nni_mtx_unlock(&d->mtx);
}